

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

CookieInfo * Curl_cookie_init(Curl_easy *data,char *file,CookieInfo *inc,_Bool newsession)

{
  FILE *pFVar1;
  int iVar2;
  bool bVar3;
  _Bool local_71;
  char *pcStack_70;
  _Bool headerline;
  char *lineptr;
  dynbuf buf;
  FILE *fp;
  FILE *handle;
  CookieInfo *c;
  _Bool newsession_local;
  CookieInfo *inc_local;
  char *file_local;
  Curl_easy *data_local;
  
  fp = (FILE *)0x0;
  handle = (FILE *)inc;
  if (inc == (CookieInfo *)0x0) {
    handle = (FILE *)(*Curl_ccalloc)(1,0x210);
    if (handle == (FILE *)0x0) {
      return (CookieInfo *)0x0;
    }
    handle[2]._IO_save_base = (char *)0x7fffffffffffffff;
  }
  *(_Bool *)((long)&handle[2]._IO_save_end + 1) = newsession;
  if (data != (Curl_easy *)0x0) {
    buf.toobig = 0;
    pFVar1 = (FILE *)fp;
    if ((file != (char *)0x0) && (*file != '\0')) {
      iVar2 = strcmp(file,"-");
      if (iVar2 == 0) {
        buf.toobig = _stdin;
      }
      else {
        buf.toobig = (size_t)fopen64(file,"rb");
        pFVar1 = (FILE *)buf.toobig;
        if (((((FILE *)buf.toobig == (FILE *)0x0) && (pFVar1 = (FILE *)fp, data != (Curl_easy *)0x0)
             ) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
           (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))))
        {
          Curl_infof(data,"WARNING: failed to open cookie file \"%s\"",file);
        }
      }
    }
    fp = (FILE *)pFVar1;
    *(undefined1 *)&handle[2]._IO_save_end = 0;
    if (buf.toobig != 0) {
      Curl_dyn_init((dynbuf *)&lineptr,5000);
      while (iVar2 = Curl_get_line((dynbuf *)&lineptr,(FILE *)buf.toobig), iVar2 != 0) {
        pcStack_70 = Curl_dyn_ptr((dynbuf *)&lineptr);
        local_71 = false;
        iVar2 = curl_strnequal(pcStack_70,"Set-Cookie:",0xb);
        if (iVar2 != 0) {
          pcStack_70 = pcStack_70 + 0xb;
          local_71 = true;
          while( true ) {
            bVar3 = false;
            if ((*pcStack_70 != '\0') && (bVar3 = true, *pcStack_70 != ' ')) {
              bVar3 = *pcStack_70 == '\t';
            }
            if (!bVar3) break;
            pcStack_70 = pcStack_70 + 1;
          }
        }
        Curl_cookie_add(data,(CookieInfo *)handle,local_71,true,pcStack_70,(char *)0x0,(char *)0x0,
                        true);
      }
      Curl_dyn_free((dynbuf *)&lineptr);
      remove_expired((CookieInfo *)handle);
      if (fp != (FILE *)0x0) {
        fclose((FILE *)fp);
      }
    }
    *(uint *)&(data->state).field_0x744 = *(uint *)&(data->state).field_0x744 & 0xfffff7ff | 0x800;
  }
  *(undefined1 *)&handle[2]._IO_save_end = 1;
  return (CookieInfo *)handle;
}

Assistant:

struct CookieInfo *Curl_cookie_init(struct Curl_easy *data,
                                    const char *file,
                                    struct CookieInfo *inc,
                                    bool newsession)
{
  struct CookieInfo *c;
  FILE *handle = NULL;

  if(!inc) {
    /* we did not get a struct, create one */
    c = calloc(1, sizeof(struct CookieInfo));
    if(!c)
      return NULL; /* failed to get memory */
    /*
     * Initialize the next_expiration time to signal that we do not have enough
     * information yet.
     */
    c->next_expiration = CURL_OFF_T_MAX;
  }
  else {
    /* we got an already existing one, use that */
    c = inc;
  }
  c->newsession = newsession; /* new session? */

  if(data) {
    FILE *fp = NULL;
    if(file && *file) {
      if(!strcmp(file, "-"))
        fp = stdin;
      else {
        fp = fopen(file, "rb");
        if(!fp)
          infof(data, "WARNING: failed to open cookie file \"%s\"", file);
        else
          handle = fp;
      }
    }

    c->running = FALSE; /* this is not running, this is init */
    if(fp) {
      struct dynbuf buf;
      Curl_dyn_init(&buf, MAX_COOKIE_LINE);
      while(Curl_get_line(&buf, fp)) {
        char *lineptr = Curl_dyn_ptr(&buf);
        bool headerline = FALSE;
        if(checkprefix("Set-Cookie:", lineptr)) {
          /* This is a cookie line, get it! */
          lineptr += 11;
          headerline = TRUE;
          while(*lineptr && ISBLANK(*lineptr))
            lineptr++;
        }

        Curl_cookie_add(data, c, headerline, TRUE, lineptr, NULL, NULL, TRUE);
      }
      Curl_dyn_free(&buf); /* free the line buffer */

      /*
       * Remove expired cookies from the hash. We must make sure to run this
       * after reading the file, and not on every cookie.
       */
      remove_expired(c);

      if(handle)
        fclose(handle);
    }
    data->state.cookie_engine = TRUE;
  }
  c->running = TRUE;          /* now, we are running */

  return c;
}